

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

void __thiscall QGraphicsItem::grabKeyboard(QGraphicsItem *this)

{
  QGraphicsItemPrivate *pQVar1;
  QGraphicsScenePrivate *in_RDI;
  long in_FS_OFFSET;
  QGraphicsItem *in_stack_00000018;
  QGraphicsScenePrivate *this_00;
  char *in_stack_ffffffffffffffb8;
  QMessageLogger *in_stack_ffffffffffffffc0;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  pQVar1 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
           operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                       *)&in_RDI->field_0x8);
  if (pQVar1->scene == (QGraphicsScene *)0x0) {
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(int)((ulong)this_00 >> 0x20),
               (char *)in_RDI);
    QMessageLogger::warning
              (local_28,"QGraphicsItem::grabKeyboard: cannot grab keyboard without scene");
  }
  else {
    pQVar1 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                         *)&in_RDI->field_0x8);
    if ((*(ulong *)&pQVar1->field_0x160 >> 5 & 1) == 0) {
      QMessageLogger::QMessageLogger
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(int)((ulong)this_00 >> 0x20),
                 (char *)in_RDI);
      QMessageLogger::warning
                (&stack0xffffffffffffffb8,
                 "QGraphicsItem::grabKeyboard: cannot grab keyboard while invisible");
    }
    else {
      QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
                ((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                  *)&in_RDI->field_0x8);
      QGraphicsScene::d_func((QGraphicsScene *)0x97d5a1);
      QGraphicsScenePrivate::grabKeyboard(this_00,in_stack_00000018);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsItem::grabKeyboard()
{
    if (!d_ptr->scene) {
        qWarning("QGraphicsItem::grabKeyboard: cannot grab keyboard without scene");
        return;
    }
    if (!d_ptr->visible) {
        qWarning("QGraphicsItem::grabKeyboard: cannot grab keyboard while invisible");
        return;
    }
    d_ptr->scene->d_func()->grabKeyboard(this);
}